

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringSaver.cpp
# Opt level: O2

StringRef __thiscall llvm::UniqueStringSaver::save(UniqueStringSaver *this,StringRef S)

{
  StringRef SVar1;
  pair<llvm::detail::DenseSetImpl<llvm::StringRef,_llvm::DenseMap<llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>,_llvm::DenseMapInfo<llvm::StringRef>_>::Iterator,_bool>
  R;
  StringRef local_38;
  pair<llvm::detail::DenseSetImpl<llvm::StringRef,_llvm::DenseMap<llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>,_llvm::DenseMapInfo<llvm::StringRef>_>::Iterator,_bool>
  local_28;
  
  local_38.Length = S.Length;
  local_38.Data = S.Data;
  detail::
  DenseSetImpl<llvm::StringRef,_llvm::DenseMap<llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>,_llvm::DenseMapInfo<llvm::StringRef>_>
  ::insert(&local_28,
           (DenseSetImpl<llvm::StringRef,_llvm::DenseMap<llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>,_llvm::DenseMapInfo<llvm::StringRef>_>
            *)(this + 8),&local_38);
  if (local_28.second == true) {
    SVar1.Length = local_38.Length;
    SVar1.Data = local_38.Data;
    SVar1 = StringSaver::save((StringSaver *)this,SVar1);
    *local_28.first.I.Ptr = (value_type)SVar1;
  }
  return (local_28.first.I.Ptr)->key;
}

Assistant:

StringRef UniqueStringSaver::save(StringRef S) {
  auto R = Unique.insert(S);
  if (R.second)                 // cache miss, need to actually save the string
    *R.first = Strings.save(S); // safe replacement with equal value
  return *R.first;
}